

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O0

bool spvReadEnvironmentFromText
               (vector<char,_std::allocator<char>_> *text,spv_target_env_conflict *env)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  int index;
  char next_char;
  char minor;
  int j;
  size_t minor_digit_pos;
  int kPrefixLength;
  char *kVersionPrefix;
  ulong uStack_28;
  char c;
  size_t i;
  spv_target_env_conflict *env_local;
  vector<char,_std::allocator<char>_> *text_local;
  
  uStack_28 = 0;
  do {
    sVar4 = std::vector<char,_std::allocator<char>_>::size(text);
    if (sVar4 <= uStack_28) {
      return false;
    }
    pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](text,uStack_28);
    if (*pvVar5 == ';') {
      sVar4 = std::vector<char,_std::allocator<char>_>::size(text);
      if (sVar4 <= uStack_28 + 0xd) {
        return false;
      }
      for (index = 1;
          (index < 0xd &&
          (cVar1 = "; Version: 1."[index],
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[]
                             (text,uStack_28 + (long)index), cVar1 == *pvVar5)); index = index + 1)
      {
      }
      if (index == 0xd) {
        pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](text,uStack_28 + 0xd);
        cVar1 = *pvVar5;
        sVar4 = std::vector<char,_std::allocator<char>_>::size(text);
        if (uStack_28 + 0xe < sVar4) {
          pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](text,uStack_28 + 0xe);
          cVar2 = *pvVar5;
        }
        else {
          cVar2 = '\0';
        }
        iVar3 = isdigit((int)cVar1);
        if ((iVar3 != 0) && (iVar3 = isdigit((int)cVar2), iVar3 == 0)) {
          iVar3 = cVar1 + -0x30;
          if (iVar3 < 0) {
            __assert_fail("index >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/spirv_target_env.cpp"
                          ,0xe7,
                          "bool spvReadEnvironmentFromText(const std::vector<char> &, spv_target_env *)"
                         );
          }
          sVar4 = std::array<spv_target_env,_7UL>::size(&ordered_universal_envs);
          if ((ulong)(long)iVar3 < sVar4) {
            pvVar6 = std::array<spv_target_env,_7UL>::operator[]
                               (&ordered_universal_envs,(long)iVar3);
            *env = *pvVar6;
            return true;
          }
        }
      }
      uStack_28 = (long)index + uStack_28;
      while ((sVar4 = std::vector<char,_std::allocator<char>_>::size(text), uStack_28 < sVar4 &&
             (pvVar5 = std::vector<char,_std::allocator<char>_>::operator[](text,uStack_28),
             *pvVar5 != '\n'))) {
        uStack_28 = uStack_28 + 1;
      }
    }
    else {
      iVar3 = isspace((int)*pvVar5);
      if (iVar3 == 0) {
        return false;
      }
    }
    uStack_28 = uStack_28 + 1;
  } while( true );
}

Assistant:

bool spvReadEnvironmentFromText(const std::vector<char>& text,
                                spv_target_env* env) {
  // Version is expected to match "; Version: 1.X"
  // Version string must occur in header, that is, initial lines of comments
  // Once a non-comment line occurs, the header has ended
  for (std::size_t i = 0; i < text.size(); ++i) {
    char c = text[i];

    if (c == ';') {
      // Try to match against the expected version string
      constexpr const char* kVersionPrefix = "; Version: 1.";
      constexpr const auto kPrefixLength = 13;
      // 'minor_digit_pos' is the expected position of the version digit.
      const auto minor_digit_pos = i + kPrefixLength;
      if (minor_digit_pos >= text.size()) return false;

      // Match the prefix.
      auto j = 1;
      for (; j < kPrefixLength; ++j) {
        if (kVersionPrefix[j] != text[i + j]) break;
      }
      // j will match the prefix length if all characters before matched
      if (j == kPrefixLength) {
        // This expects only one digit in the minor number.
        static_assert(((spv::Version >> 8) & 0xff) < 10);
        char minor = text[minor_digit_pos];
        char next_char =
            minor_digit_pos + 1 < text.size() ? text[minor_digit_pos + 1] : 0;
        if (std::isdigit(minor) && !std::isdigit(next_char)) {
          const auto index = minor - '0';
          assert(index >= 0);
          if (static_cast<size_t>(index) < ordered_universal_envs.size()) {
            *env = ordered_universal_envs[index];
            return true;
          }
        }
      }

      // If no match, determine whether the header has ended (in which case,
      // assumption has failed.)
      // Skip until the next line.
      i += j;
      for (; i < text.size(); ++i) {
        if (text[i] == '\n') break;
      }
    } else if (!std::isspace(c)) {
      // Allow blanks, but end the search if we find something else.
      break;
    }
  }
  return false;
}